

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64VectorOfStructs(void)

{
  bool expval;
  Offset<RootTable> root;
  uint *puVar1;
  ulong uVar2;
  int *piVar3;
  long *plVar4;
  ulong *puVar5;
  char *__function;
  int *piVar6;
  vector<LeafStruct,_std::allocator<LeafStruct>_> big_leaves;
  vector<LeafStruct,_std::allocator<LeafStruct>_> far_leaves;
  FlatBufferBuilder64 builder;
  vector<LeafStruct,_std::allocator<LeafStruct>_> local_118;
  vector<LeafStruct,_std::allocator<LeafStruct>_> local_f8;
  VerifierTemplate<false> local_e0;
  FlatBufferBuilder64 local_98;
  
  local_98.buf_.allocator_ = (Allocator *)0x0;
  local_98.buf_.own_allocator_ = false;
  local_98.buf_.initial_size_ = 0x400;
  local_98.buf_.max_size_ = 0x7fffffffffffffff;
  local_98.buf_.buffer_minalign_ = 8;
  local_98.length_of_64_bit_region_ = 0;
  local_98.nested = false;
  local_98.finished = false;
  local_98.buf_.reserved_ = 0;
  local_98.buf_.size_ = 0;
  local_98.buf_.buf_ = (uint8_t *)0x0;
  local_98.buf_.cur_._0_6_ = 0;
  local_98.buf_.cur_._6_2_ = 0;
  local_98.buf_.scratch_._0_6_ = 0;
  local_98._78_8_ = 0;
  local_98.minalign_ = 1;
  local_98.force_defaults_ = false;
  local_98.dedup_vtables_ = true;
  local_98.string_pool = (StringOffsetMap *)0x0;
  local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LeafStruct *)0x0;
  local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (LeafStruct *)0x0;
  local_e0.buf_ = (uint8_t *)0x7b;
  local_e0.size_ = 0x4012449ba5e353f8;
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
            (&local_f8,(iterator)0x0,(LeafStruct *)&local_e0);
  local_e0.buf_ = (uint8_t *)0x3db;
  local_e0.size_ = 0x401a2c083126e979;
  if (local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
              (&local_f8,
               (iterator)
               local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
               super__Vector_impl_data._M_finish,(LeafStruct *)&local_e0);
  }
  else {
    (local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->a_ = 0x3db;
    (local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->padding0__ = 0;
    (local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->b_ = 6.543;
    local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (LeafStruct *)0x0;
  local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LeafStruct *)0x0;
  local_e0.buf_ = (uint8_t *)0x48;
  local_e0.size_ = 0x4052333333333333;
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
            (&local_118,(iterator)0x0,(LeafStruct *)&local_e0);
  local_e0.buf_ = (uint8_t *)0x52;
  local_e0.size_ = 0x4054b33333333333;
  if (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
              (&local_118,
               (iterator)
               local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
               super__Vector_impl_data._M_finish,(LeafStruct *)&local_e0);
  }
  else {
    (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->a_ = 0x52;
    (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->padding0__ = 0;
    (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->b_ = 82.8;
    local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_e0.buf_ = (uint8_t *)0x5c;
  local_e0.size_ = 0x4057333333333333;
  if (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
              (&local_118,
               (iterator)
               local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
               super__Vector_impl_data._M_finish,(LeafStruct *)&local_e0);
  }
  else {
    (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->a_ = 0x5c;
    (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->padding0__ = 0;
    (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->b_ = 92.8;
    local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  root = CreateRootTableDirect
                   (&local_98,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,0,
                    (char *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (char *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    &local_f8,&local_118,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  FlatBufferBuilderImpl<true>::Finish(&local_98,root.o,(char *)0x0,false);
  local_e0.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_98);
  local_e0.size_ = local_98.buf_.size_;
  local_e0.opts_.max_depth = 0x40;
  local_e0.opts_.max_tables = 1000000;
  local_e0.opts_.check_alignment = true;
  local_e0.opts_.check_nested_flatbuffers = true;
  local_e0.opts_.max_size = 0x7fffffffffffffff;
  local_e0.opts_.assert = true;
  local_e0.upper_bound_ = 0;
  local_e0.depth_ = 0;
  local_e0.num_tables_ = 0;
  local_e0.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (0x7ffffffffffffffe < local_98.buf_.size_) {
    __assert_fail("size_ < opts.max_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                  ,0x2f,
                  "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                 );
  }
  expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_e0,(char *)0x0,0);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x141,"");
  puVar1 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_98);
  if (puVar1 == (uint *)0x0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)((ulong)*puVar1 + (long)puVar1);
  }
  uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x10 - (long)*piVar6));
  TestEq<unsigned_int,unsigned_long>
            (*(uint *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2),
             (long)local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4,
             "\'root_table->far_struct_vector()->size()\' != \'far_leaves.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x145,"");
  if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) ||
     (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x10 - (long)*piVar6)), uVar2 == 0)) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
  }
  if (*piVar3 != 0) {
    TestEq<int,int>(piVar3[1],0x7b,"\'root_table->far_struct_vector()->Get(0)->a()\' != \'123\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x146,"");
    if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) ||
       (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x10 - (long)*piVar6)), uVar2 == 0)) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
    }
    if (*piVar3 != 0) {
      TestEq<double,double>
                (*(double *)(piVar3 + 3),4.567,
                 "\'root_table->far_struct_vector()->Get(0)->b()\' != \'4.567\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                 ,0x147,"");
      if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) ||
         (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x10 - (long)*piVar6)), uVar2 == 0)) {
        puVar1 = (uint *)0x0;
      }
      else {
        puVar1 = (uint *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
      }
      if (1 < *puVar1) {
        TestEq<int,int>(puVar1[5],0x3db,
                        "\'root_table->far_struct_vector()->Get(1)->a()\' != \'987\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                        ,0x148,"");
        if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) ||
           (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x10 - (long)*piVar6)), uVar2 == 0)) {
          puVar1 = (uint *)0x0;
        }
        else {
          puVar1 = (uint *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
        }
        if (1 < *puVar1) {
          TestEq<double,double>
                    (*(double *)(puVar1 + 7),6.543,
                     "\'root_table->far_struct_vector()->Get(1)->b()\' != \'6.543\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x149,"");
          uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
          TestEq<unsigned_long,unsigned_long>
                    (*(unsigned_long *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2),
                     (long)local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 4,
                     "\'root_table->big_struct_vector()->size()\' != \'big_leaves.size()\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x14b,"");
          if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) ||
             (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6)), uVar2 == 0)) {
            plVar4 = (long *)0x0;
          }
          else {
            plVar4 = (long *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
          }
          if (*plVar4 != 0) {
            TestEq<int,int>((int)plVar4[1],0x48,
                            "\'root_table->big_struct_vector()->Get(0)->a()\' != \'72\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                            ,0x14c,"");
            if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) ||
               (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6)), uVar2 == 0)) {
              plVar4 = (long *)0x0;
            }
            else {
              plVar4 = (long *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
            }
            if (*plVar4 != 0) {
              TestEq<double,double>
                        ((double)plVar4[2],72.8,
                         "\'root_table->big_struct_vector()->Get(0)->b()\' != \'72.8\'",
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                         ,0x14d,"");
              if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) ||
                 (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6)), uVar2 == 0)) {
                puVar5 = (ulong *)0x0;
              }
              else {
                puVar5 = (ulong *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
              }
              if (1 < *puVar5) {
                TestEq<int,int>((int)puVar5[3],0x52,
                                "\'root_table->big_struct_vector()->Get(1)->a()\' != \'82\'",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                ,0x14e,"");
                if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) ||
                   (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6)), uVar2 == 0))
                {
                  puVar5 = (ulong *)0x0;
                }
                else {
                  puVar5 = (ulong *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
                }
                if (1 < *puVar5) {
                  TestEq<double,double>
                            ((double)puVar5[4],82.8,
                             "\'root_table->big_struct_vector()->Get(1)->b()\' != \'82.8\'",
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                             ,0x14f,"");
                  if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) ||
                     (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6)), uVar2 == 0)
                     ) {
                    puVar5 = (ulong *)0x0;
                  }
                  else {
                    puVar5 = (ulong *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
                  }
                  if (2 < *puVar5) {
                    TestEq<int,int>((int)puVar5[5],0x5c,
                                    "\'root_table->big_struct_vector()->Get(2)->a()\' != \'92\'",
                                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                    ,0x150,"");
                    if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) ||
                       (uVar2 = (ulong)*(ushort *)((long)piVar6 + (0x12 - (long)*piVar6)),
                       uVar2 == 0)) {
                      puVar5 = (ulong *)0x0;
                    }
                    else {
                      puVar5 = (ulong *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
                    }
                    if (2 < *puVar5) {
                      TestEq<double,double>
                                ((double)puVar5[6],92.8,
                                 "\'root_table->big_struct_vector()->Get(2)->b()\' != \'92.8\'",
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                 ,0x151,"");
                      if (local_118.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_118.
                                        super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_118.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_118.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_f8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_f8.
                                        super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_f8.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_f8.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_98);
                      return;
                    }
                  }
                }
              }
            }
          }
          __function = 
          "return_type flatbuffers::Vector<const LeafStruct *, unsigned long>::Get(SizeT) const [T = const LeafStruct *, SizeT = unsigned long]"
          ;
          goto LAB_001ab304;
        }
      }
    }
  }
  __function = 
  "return_type flatbuffers::Vector<const LeafStruct *>::Get(SizeT) const [T = const LeafStruct *, SizeT = unsigned int]"
  ;
LAB_001ab304:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

void Offset64VectorOfStructs() {
  FlatBufferBuilder64 builder;

  std::vector<LeafStruct> far_leaves;
  far_leaves.emplace_back(LeafStruct{ 123, 4.567 });
  far_leaves.emplace_back(LeafStruct{ 987, 6.543 });

  std::vector<LeafStruct> big_leaves;
  big_leaves.emplace_back(LeafStruct{ 72, 72.8 });
  big_leaves.emplace_back(LeafStruct{ 82, 82.8 });
  big_leaves.emplace_back(LeafStruct{ 92, 92.8 });

  // Add the two vectors of leaf structs.
  const Offset<RootTable> root_table_offset =
      CreateRootTableDirect(builder, nullptr, 0, nullptr, nullptr, nullptr,
                            nullptr, &far_leaves, &big_leaves);

  // Finish the buffer.
  builder.Finish(root_table_offset);

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

  TEST_EQ(VerifyRootTableBuffer(verifier), true);

  // Verify the data.
  const RootTable *root_table = GetRootTable(builder.GetBufferPointer());
  TEST_EQ(root_table->far_struct_vector()->size(), far_leaves.size());
  TEST_EQ(root_table->far_struct_vector()->Get(0)->a(), 123);
  TEST_EQ(root_table->far_struct_vector()->Get(0)->b(), 4.567);
  TEST_EQ(root_table->far_struct_vector()->Get(1)->a(), 987);
  TEST_EQ(root_table->far_struct_vector()->Get(1)->b(), 6.543);

  TEST_EQ(root_table->big_struct_vector()->size(), big_leaves.size());
  TEST_EQ(root_table->big_struct_vector()->Get(0)->a(), 72);
  TEST_EQ(root_table->big_struct_vector()->Get(0)->b(), 72.8);
  TEST_EQ(root_table->big_struct_vector()->Get(1)->a(), 82);
  TEST_EQ(root_table->big_struct_vector()->Get(1)->b(), 82.8);
  TEST_EQ(root_table->big_struct_vector()->Get(2)->a(), 92);
  TEST_EQ(root_table->big_struct_vector()->Get(2)->b(), 92.8);
}